

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O3

char * fy_tag_directive_token_handle(fy_token *fyt,size_t *lenp)

{
  fy_input *pfVar1;
  char *pcVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0;
  if (fyt == (fy_token *)0x0) {
    pcVar2 = (char *)0x0;
    goto LAB_0013b824;
  }
  pcVar2 = (char *)0x0;
  if (fyt->type != FYTT_TAG_DIRECTIVE) goto LAB_0013b824;
  pfVar1 = (fyt->handle).fyi;
  lVar5 = 0x48;
  switch((pfVar1->cfg).type) {
  case fyit_file:
    pvVar3 = (pfVar1->field_11).file.addr;
    if (pvVar3 == (void *)0x0) goto switchD_0013b806_caseD_1;
    break;
  case fyit_memory:
  case fyit_alloc:
    lVar5 = 0x28;
  case fyit_stream:
switchD_0013b806_caseD_1:
    pvVar3 = *(void **)((long)&(pfVar1->node).next + lVar5);
    if (pvVar3 == (void *)0x0) {
switchD_0013b806_default:
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.h"
                    ,0x9a,"const void *fy_input_start(const struct fy_input *)");
    }
    break;
  default:
    goto switchD_0013b806_default;
  }
  pcVar2 = (char *)((long)pvVar3 + (fyt->handle).start_mark.input_pos);
  uVar4 = (ulong)(fyt->field_9).tag_directive.tag_length;
LAB_0013b824:
  *lenp = uVar4;
  return pcVar2;
}

Assistant:

const char *fy_tag_directive_token_handle(struct fy_token *fyt, size_t *lenp) {
    const char *ptr;

    if (!fyt || fyt->type != FYTT_TAG_DIRECTIVE) {
        *lenp = 0;
        return NULL;
    }
    ptr = fy_atom_data(&fyt->handle);
    *lenp = fyt->tag_directive.tag_length;
    return ptr;
}